

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeventdispatcher_glib.cpp
# Opt level: O2

gboolean timerSourcePrepareHelper(GTimerSource *src,gint *timeout)

{
  uint uVar1;
  duration<long,_std::ratio<1L,_1000000000L>_> dVar2;
  long lVar3;
  gint gVar4;
  long lVar6;
  long in_FS_OFFSET;
  optional<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> oVar7;
  duration<long,_std::ratio<1L,_1000L>_> local_28;
  _Storage<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true> local_20;
  undefined1 local_18;
  long local_10;
  long lVar5;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (((src->processEventsFlags).super_QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4>.
       super_QFlagsStorage<QEventLoop::ProcessEventsFlag>.i & 8) == 0) {
    oVar7 = QTimerInfoList::timerWait(&src->timerList);
    local_20 = oVar7.
               super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               ._M_payload;
    local_18 = oVar7.
               super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               ._M_engaged;
    local_28.__r = -1;
    dVar2 = std::optional<std::chrono::duration<long,std::ratio<1l,1000000000l>>>::
            value_or<std::chrono::duration<long,std::ratio<1l,1000l>>>
                      ((optional<std::chrono::duration<long,std::ratio<1l,1000000000l>>> *)
                       &local_20._M_value,&local_28);
    lVar6 = (ulong)((dVar2.__r / 1000000) * 1000000 < dVar2.__r) + dVar2.__r / 1000000;
    lVar3 = 0x7fffffff;
    if (lVar6 < 0x7fffffff) {
      lVar3 = lVar6;
    }
    lVar5 = -0x80000000;
    if (-0x80000000 < lVar3) {
      lVar5 = lVar3;
    }
    gVar4 = (gint)lVar5;
    uVar1 = (uint)(lVar6 == 0);
  }
  else {
    uVar1 = 1;
    gVar4 = -1;
  }
  *timeout = gVar4;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return uVar1;
  }
  __stack_chk_fail();
}

Assistant:

static gboolean timerSourcePrepareHelper(GTimerSource *src, gint *timeout)
{
    if (src->processEventsFlags & QEventLoop::X11ExcludeTimers) {
        *timeout = -1;
        return true;
    }

    auto remaining = src->timerList.timerWait().value_or(-1ms);
    *timeout = q26::saturate_cast<gint>(ceil<milliseconds>(remaining).count());

    return (*timeout == 0);
}